

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty
          (FBXExportProperty *this,vector<float,_std::allocator<float>_> *va)

{
  pointer puVar1;
  pointer pfVar2;
  size_t i;
  ulong uVar3;
  allocator_type local_11;
  
  this->type = 'f';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->data,
             (long)(va->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(va->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start,&local_11);
  puVar1 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar3 = 0;
      pfVar2 = (va->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(va->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar2 >> 2);
      uVar3 = uVar3 + 1) {
    *(float *)(puVar1 + uVar3 * 4) = pfVar2[uVar3];
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const std::vector<float>& va)
: type('f')
, data(4 * va.size()) {
    float* d = reinterpret_cast<float*>(data.data());
    for (size_t i = 0; i < va.size(); ++i) {
        d[i] = va[i];
    }
}